

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.h
# Opt level: O1

void __thiscall MiniScript::Intrinsic::AddParam(Intrinsic *this,String *name)

{
  long *plVar1;
  Value local_38;
  String local_28;
  
  local_28.isTemp = false;
  local_28.ss = name->ss;
  if (local_28.ss != (StringStorage *)0x0) {
    plVar1 = &((local_28.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
  }
  local_38.type = Value::null;
  local_38.noInvoke = DAT_001d3321._0_1_;
  local_38.localOnly = DAT_001d3321._1_1_;
  local_38.data.ref = DAT_001d3328;
  if ((Temp < Value::null) && (DAT_001d3328 != (RefCountedStorage *)0x0)) {
    DAT_001d3328->refCount = DAT_001d3328->refCount + 1;
  }
  AddParam(this,&local_28,&local_38);
  if ((Temp < local_38.type) && (local_38.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_38.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_38.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_38.data.number = 0.0;
  }
  if ((local_28.ss != (StringStorage *)0x0) && (local_28.isTemp == false)) {
    plVar1 = &((local_28.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_28.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  return;
}

Assistant:

~IntrinsicResult() { release(); }